

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O2

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B,int n,int k)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (C._M_current == B._M_current) {
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (T,C,n,k);
  }
  uVar11 = 0;
  getBuckets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (C,B,k,false);
  uVar9 = n - 1;
  uVar8 = (ulong)T._M_current[(long)n + -1];
  iVar1 = B._M_current[uVar8];
  uVar5 = uVar9;
  if ((1 < n) && (uVar5 = -n, T._M_current[(long)n + -1] <= T._M_current[(ulong)(uint)n - 2])) {
    uVar5 = uVar9;
  }
  SA._M_current[iVar1] = uVar5;
  puVar3 = (uint *)(SA._M_current + iVar1 + 1);
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  for (; uVar6 != uVar11; uVar11 = uVar11 + 1) {
    uVar5 = SA._M_current[uVar11];
    SA._M_current[uVar11] = ~uVar5;
    if (0 < (long)(int)uVar5) {
      uVar7 = T._M_current[uVar5 - 1];
      if (uVar7 != (uint)uVar8) {
        B._M_current[uVar8] = (int)((ulong)((long)puVar3 - (long)SA._M_current) >> 2);
        puVar3 = (uint *)(SA._M_current + B._M_current[uVar7]);
        uVar8 = (ulong)uVar7;
      }
      uVar7 = 0;
      if ((uVar5 != 1) && (uVar7 = uVar5 - 1, T._M_current[(long)(int)uVar5 + -2] < (uint)uVar8)) {
        uVar7 = -uVar5;
      }
      *puVar3 = uVar7;
      puVar3 = puVar3 + 1;
    }
  }
  if (C._M_current == B._M_current) {
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (T,C,n,k);
  }
  getBuckets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (C,B,k,true);
  piVar4 = SA._M_current + *B._M_current;
  uVar8 = 0;
  while( true ) {
    uVar5 = (uint)uVar8;
    if ((int)uVar9 < 0) break;
    uVar7 = SA._M_current[uVar9];
    if ((long)(int)uVar7 < 1) {
      SA._M_current[uVar9] = ~uVar7;
    }
    else {
      uVar10 = uVar7 - 1;
      uVar2 = T._M_current[uVar10];
      if (uVar2 != uVar5) {
        B._M_current[uVar8] = (int)((ulong)((long)piVar4 - (long)SA._M_current) >> 2);
        piVar4 = SA._M_current + B._M_current[uVar2];
        uVar5 = uVar2;
      }
      if ((uVar10 == 0) || (uVar5 < T._M_current[(long)(int)uVar7 + -2])) {
        uVar10 = -uVar7;
      }
      piVar4[-1] = uVar10;
      piVar4 = piVar4 + -1;
    }
    uVar9 = uVar9 - 1;
    uVar8 = (ulong)uVar5;
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}